

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
::_insert_entry(Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
                *this,ID_index rowIndex)

{
  Matrix_entry *local_20;
  Entry *newEntry;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  *pUStack_10;
  ID_index rowIndex_local;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  *this_local;
  
  newEntry._4_4_ = rowIndex;
  pUStack_10 = this;
  local_20 = New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>
             ::construct<unsigned_int&,unsigned_int&>
                       ((New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>
                         *)this->entryPool_,(uint *)this,(uint *)((long)&newEntry + 4));
  std::
  unordered_set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>_>
  ::insert(&this->column_,&local_20);
  Row_access<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  ::insert_entry(&this->super_Row_access_option,newEntry._4_4_,local_20);
  return;
}

Assistant:

inline void Unordered_set_column<Master_matrix>::_insert_entry(ID_index rowIndex)
{
  if constexpr (Master_matrix::Option_list::has_row_access) {
    Entry* newEntry = entryPool_->construct(RA_opt::columnIndex_, rowIndex);
    column_.insert(newEntry);
    RA_opt::insert_entry(rowIndex, newEntry);
  } else {
    Entry* newEntry = entryPool_->construct(rowIndex);
    column_.insert(newEntry);
  }
}